

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

int ON_SubDToBrepParameters::CompareFromPointers
              (ON_SubDToBrepParameters *lhs,ON_SubDToBrepParameters *rhs)

{
  ON_SubDToBrepParameters *rhs_local;
  ON_SubDToBrepParameters *lhs_local;
  
  if (lhs == rhs) {
    lhs_local._4_4_ = 0;
  }
  else if (lhs == (ON_SubDToBrepParameters *)0x0) {
    lhs_local._4_4_ = 1;
  }
  else if (rhs == (ON_SubDToBrepParameters *)0x0) {
    lhs_local._4_4_ = -1;
  }
  else {
    lhs_local._4_4_ = Compare(lhs,rhs);
  }
  return lhs_local._4_4_;
}

Assistant:

int ON_SubDToBrepParameters::CompareFromPointers(
  const ON_SubDToBrepParameters* lhs,
  const ON_SubDToBrepParameters* rhs
)
{
  if (lhs == rhs)
    return 0;
  if (nullptr == lhs)
    return 1;
  if (nullptr == rhs)
    return -1;
  return ON_SubDToBrepParameters::Compare(*lhs, *rhs);
}